

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

int IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin(TRANSPORT_LL_HANDLE handle)

{
  STRING_HANDLE pSVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0xd08;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xd08;
    }
    pcVar5 = "Invalid handle parameter. NULL.";
    iVar3 = 0xd07;
LAB_0012ac26:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
              ,"IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin",iVar3,1,pcVar5);
  }
  else {
    if (*(long *)((long)handle + 0x10) == 0) {
      pSVar1 = STRING_construct("$iothub/twin/res/#");
      *(STRING_HANDLE *)((long)handle + 0x10) = pSVar1;
      if (pSVar1 == (STRING_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        iVar4 = 0xd12;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0xd12;
        }
        pcVar5 = "Failure: unable constructing reported state topic";
        iVar3 = 0xd11;
        goto LAB_0012ac26;
      }
      *(byte *)((long)handle + 0x30) = *(byte *)((long)handle + 0x30) | 1;
    }
    changeStateToSubscribeIfAllowed((PMQTTTRANSPORT_HANDLE_DATA)handle);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin(TRANSPORT_LL_HANDLE handle)
{
    int result;
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else
    {
        if (transport_data->topic_GetState == NULL)
        {
            transport_data->topic_GetState = STRING_construct(TOPIC_GET_DESIRED_STATE);
            if (transport_data->topic_GetState == NULL)
            {
                LogError("Failure: unable constructing reported state topic");
                result = MU_FAILURE;
            }
            else
            {
                transport_data->topics_ToSubscribe |= SUBSCRIBE_GET_REPORTED_STATE_TOPIC;
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
        if (result == 0)
        {
            changeStateToSubscribeIfAllowed(transport_data);
        }
    }
    return result;
}